

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void mi_arenas_try_purge(_Bool force,_Bool visit_all)

{
  mi_arena_t *arena;
  size_t sVar1;
  mi_atomic_guard_t mVar2;
  _Bool _Var3;
  bool bVar4;
  long lVar5;
  mi_msecs_t mVar6;
  size_t sVar7;
  mi_atomic_guard_t mVar8;
  size_t sVar9;
  ulong uVar10;
  mi_msecs_t mVar11;
  byte bVar12;
  ulong bitmap_idx;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  bool bVar20;
  
  _Var3 = _mi_preloading();
  if ((((!_Var3) && (lVar5 = mi_arena_purge_delay(), 0 < lVar5)) &&
      ((mVar6 = _mi_clock_now(), sVar1 = mi_arena_count, force ||
       (mVar6 <= mi_arenas_purge_expire && mi_arenas_purge_expire != 0)))) && (mi_arena_count != 0))
  {
    sVar7 = 2;
    if (visit_all) {
      sVar7 = mi_arena_count;
    }
    bVar20 = true;
    mVar8 = 0;
    while (bVar20) {
      LOCK();
      bVar20 = mVar8 == mi_arenas_try_purge::purge_guard;
      mVar2 = mi_arenas_try_purge::purge_guard;
      if (bVar20) {
        mi_arenas_try_purge::purge_guard = 1;
        mVar2 = mVar8;
      }
      mVar8 = mVar2;
      UNLOCK();
      if (!bVar20) {
        return;
      }
      lVar5 = mi_arena_purge_delay();
      mi_arenas_purge_expire = lVar5 + mVar6;
      sVar16 = sVar7;
      for (sVar15 = 0; sVar15 != sVar1; sVar15 = sVar15 + 1) {
        arena = mi_arenas[sVar15];
        if (((arena != (mi_arena_t *)0x0) && ((arena->memid).is_pinned == false)) &&
           ((lVar5 = arena->purge_expire, force || (lVar5 <= mVar6 && lVar5 != 0)))) {
          uVar14 = 0;
          LOCK();
          if (lVar5 == arena->purge_expire) {
            arena->purge_expire = 0;
          }
          UNLOCK();
          _mi_stat_counter_increase(&_mi_stats_main.arena_purges,1);
          bVar20 = true;
          bVar4 = false;
          for (; uVar14 < arena->field_count; uVar14 = uVar14 + 1) {
            uVar17 = arena->blocks_purge[uVar14];
            if (uVar17 != 0) {
              for (uVar13 = 0; uVar13 < 0x40; uVar13 = uVar13 + sVar9 + 1) {
                sVar9 = 0;
                while ((sVar18 = 0x40 - uVar13, uVar13 + sVar9 != 0x40 &&
                       (sVar18 = sVar9,
                       (uVar17 >> ((ulong)(uint)((int)uVar13 + (int)sVar9) & 0x3f) & 1) != 0))) {
                  sVar9 = sVar9 + 1;
                }
                bitmap_idx = uVar13 | uVar14 * 0x40;
                do {
                  sVar9 = sVar18;
                  if (sVar9 == 0) goto LAB_0049c51b;
                  _Var3 = _mi_bitmap_try_claim
                                    (arena->blocks_inuse,arena->field_count,sVar9,bitmap_idx);
                  sVar18 = sVar9 - 1;
                } while (!_Var3);
                uVar17 = arena->blocks_purge[uVar14];
                bVar12 = 0;
                for (uVar19 = uVar13; uVar19 < uVar13 + sVar9; uVar19 = (uVar19 - lVar5) + 1) {
                  lVar5 = 0;
                  for (uVar10 = uVar19;
                      (uVar10 < uVar13 + sVar9 && ((uVar17 >> (uVar10 & 0x3f) & 1) != 0));
                      uVar10 = uVar10 + 1) {
                    lVar5 = lVar5 + -1;
                  }
                  if (lVar5 != 0) {
                    mi_arena_purge(arena,uVar19 + uVar14 * 0x40,-lVar5);
                    bVar12 = bVar12 | sVar9 + lVar5 == 0;
                  }
                }
                bVar20 = (bool)(bVar12 & bVar20);
                _mi_bitmap_unclaim(arena->blocks_inuse,arena->field_count,sVar9,bitmap_idx);
                bVar4 = true;
LAB_0049c51b:
              }
            }
          }
          if (!bVar20) {
            lVar5 = mi_arena_purge_delay();
            mVar11 = _mi_clock_now();
            LOCK();
            if (arena->purge_expire == 0) {
              arena->purge_expire = mVar11 + lVar5;
            }
            UNLOCK();
          }
          if (bVar4) {
            if (sVar16 < 2) goto LAB_0049c591;
            sVar16 = sVar16 - 1;
          }
        }
      }
      mi_arenas_purge_expire = 0;
LAB_0049c591:
      mi_arenas_try_purge::purge_guard = 0;
      bVar20 = false;
    }
  }
  return;
}

Assistant:

static void mi_arenas_try_purge( bool force, bool visit_all ) 
{
  if (_mi_preloading() || mi_arena_purge_delay() <= 0) return;  // nothing will be scheduled

  // check if any arena needs purging?
  const mi_msecs_t now = _mi_clock_now();
  mi_msecs_t arenas_expire = mi_atomic_loadi64_acquire(&mi_arenas_purge_expire);
  if (!force && (arenas_expire == 0 || arenas_expire < now)) return;

  const size_t max_arena = mi_atomic_load_acquire(&mi_arena_count);
  if (max_arena == 0) return;

  // allow only one thread to purge at a time
  static mi_atomic_guard_t purge_guard;
  mi_atomic_guard(&purge_guard)
  {
    // increase global expire: at most one purge per delay cycle
    mi_atomic_storei64_release(&mi_arenas_purge_expire, now + mi_arena_purge_delay());  
    size_t max_purge_count = (visit_all ? max_arena : 2);
    bool all_visited = true;
    for (size_t i = 0; i < max_arena; i++) {
      mi_arena_t* arena = mi_atomic_load_ptr_acquire(mi_arena_t, &mi_arenas[i]);
      if (arena != NULL) {
        if (mi_arena_try_purge(arena, now, force)) {
          if (max_purge_count <= 1) {
            all_visited = false;
            break;
          }
          max_purge_count--;
        }
      }
    }
    if (all_visited) {
      // all arena's were visited and purged: reset global expire
      mi_atomic_storei64_release(&mi_arenas_purge_expire, 0);
    }
  }
}